

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * cmFileAPI::BuildReplyError(Value *__return_storage_ptr__,string *error)

{
  Value *this;
  Value local_48;
  undefined1 local_19;
  string *local_18;
  string *error_local;
  Value *e;
  
  local_19 = 0;
  local_18 = error;
  error_local = (string *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_48,local_18);
  this = Json::Value::operator[](__return_storage_ptr__,"error");
  Json::Value::operator=(this,&local_48);
  Json::Value::~Value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReplyError(std::string const& error)
{
  Json::Value e = Json::objectValue;
  e["error"] = error;
  return e;
}